

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specs.hpp
# Opt level: O1

ostream * sciplot::operator<<(ostream *stream,Specs<sciplot::AxisLabelSpecs> *obj)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*obj->_vptr_Specs[2])(&local_30);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return poVar1;
}

Assistant:

auto operator<<(std::ostream& stream, const Specs<DerivedSpecs>& obj) -> std::ostream&
{
    return stream << obj.repr();
}